

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::DirectiveSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0xd9) {
    if ((((0x2f < kind - DefaultNetTypeDirective) ||
         ((0xe00900000041U >> ((ulong)(kind - DefaultNetTypeDirective) & 0x3f) & 1) == 0)) &&
        (kind != BeginKeywordsDirective)) && (kind != CellDefineDirective)) {
      return false;
    }
  }
  else if ((int)kind < 0x162) {
    if (((0x3b < kind - IfDefDirective) ||
        ((0x800004000040005U >> ((ulong)(kind - IfDefDirective) & 0x3f) & 1) == 0)) &&
       (kind != NoUnconnectedDriveDirective)) {
      return false;
    }
  }
  else if (((0x28 < kind - TimeScaleDirective) ||
           ((0x1c000000001U >> ((ulong)(kind - TimeScaleDirective) & 0x3f) & 1) == 0)) &&
          ((kind != PragmaDirective && (kind != ResetAllDirective)))) {
    return false;
  }
  return true;
}

Assistant:

bool DirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BeginKeywordsDirective:
        case SyntaxKind::CellDefineDirective:
        case SyntaxKind::DefaultNetTypeDirective:
        case SyntaxKind::DefineDirective:
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::ElseDirective:
        case SyntaxKind::EndCellDefineDirective:
        case SyntaxKind::EndIfDirective:
        case SyntaxKind::EndKeywordsDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
        case SyntaxKind::IncludeDirective:
        case SyntaxKind::LineDirective:
        case SyntaxKind::MacroUsage:
        case SyntaxKind::NoUnconnectedDriveDirective:
        case SyntaxKind::PragmaDirective:
        case SyntaxKind::ResetAllDirective:
        case SyntaxKind::TimeScaleDirective:
        case SyntaxKind::UnconnectedDriveDirective:
        case SyntaxKind::UndefDirective:
        case SyntaxKind::UndefineAllDirective:
            return true;
        default:
            return false;
    }
}